

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::InvisibleButton(char *str_id,ImVec2 *size_arg)

{
  ImVec2 size_00;
  ImGuiID flags;
  ImGuiWindow *out_held;
  float *in_RSI;
  undefined8 in_RDI;
  ImGuiWindowTempData *min;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImVec2 size;
  ImGuiID id;
  ImGuiWindow *window;
  ImVec2 *in_stack_ffffffffffffff98;
  ImVec2 in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  ImRect *bb_00;
  ImGuiID id_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  id_00 = (ImGuiID)((ulong)in_RDI >> 0x20);
  out_held = GetCurrentWindow();
  if ((out_held->SkipItems & 1U) == 0) {
    if (((*in_RSI == 0.0) && (!NAN(*in_RSI))) || ((in_RSI[1] == 0.0 && (!NAN(in_RSI[1]))))) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x2c5,"InvisibleButton","ImGui ASSERT FAILED: %s",
                  "size_arg.x != 0.0f && size_arg.y != 0.0f");
    }
    flags = ImGuiWindow::GetID((ImGuiWindow *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                               ,(char *)in_stack_ffffffffffffffb0);
    bb_00 = *(ImRect **)in_RSI;
    size_00.y = in_stack_ffffffffffffffbc;
    size_00.x = in_stack_ffffffffffffffb8;
    CalcItemSize(size_00,in_stack_ffffffffffffffb0.y,in_stack_ffffffffffffffb0.x);
    min = &out_held->DC;
    ::operator+(in_stack_ffffffffffffff98,(ImVec2 *)0x2adaab);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffffb8,&min->CursorPos,
                   (ImVec2 *)&stack0xffffffffffffffb0);
    ItemSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc);
    bVar1 = ItemAdd(bb_00,(ImGuiID)in_stack_ffffffffffffffc4,
                    (ImRect *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (bVar1) {
      bVar1 = ButtonBehavior((ImRect *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                             ,id_00,(bool *)in_RSI,(bool *)out_held,flags);
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ImGui::InvisibleButton(const char* str_id, const ImVec2& size_arg)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    // Cannot use zero-size for InvisibleButton(). Unlike Button() there is not way to fallback using the label size.
    IM_ASSERT(size_arg.x != 0.0f && size_arg.y != 0.0f);

    const ImGuiID id = window->GetID(str_id);
    ImVec2 size = CalcItemSize(size_arg, 0.0f, 0.0f);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(size);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    return pressed;
}